

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init_tests.cpp
# Opt level: O3

void __thiscall
wallet::init_tests::walletinit_verify_walletdir_does_not_exist::test_method
          (walletinit_verify_walletdir_does_not_exist *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string message;
  MatchFn match;
  int iVar2;
  mapped_type *walletdir_path;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string msg;
  DebugLogHelper debugloghelper6;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  undefined8 in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffed8;
  undefined8 in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  _func_int **in_stack_fffffffffffffef0;
  bool in_stack_fffffffffffffef8;
  undefined7 in_stack_fffffffffffffef9;
  _Invoker_type in_stack_ffffffffffffff00;
  assertion_result local_f0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  char *local_c8;
  char *local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  code *local_a8;
  code *local_a0;
  long *local_90 [2];
  long local_80 [2];
  DebugLogHelper local_70;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  paVar1 = &local_70.m_message.field_2;
  local_70.m_message._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"nonexistent","");
  walletdir_path =
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path>_>_>
       ::operator[](&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_walletdir_path_cases,
                    &local_70.m_message);
  InitWalletDirTestingSetup::SetWalletDir(&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,walletdir_path);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_70.m_message._M_dataplus._M_p,
                    local_70.m_message.field_2._M_allocated_capacity + 1);
  }
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"does not exist","");
  local_b8 = 0;
  uStack_b0 = 0;
  local_a0 = std::
             _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_DebugLogHelper::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/logging.h:35:66)>
             ::_M_invoke;
  local_a8 = std::
             _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_DebugLogHelper::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/logging.h:35:66)>
             ::_M_manager;
  message._M_dataplus._M_p._4_4_ = in_stack_fffffffffffffecc;
  message._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffec8;
  message._M_string_length = in_stack_fffffffffffffed0;
  message.field_2._M_allocated_capacity = in_stack_fffffffffffffed8;
  message.field_2._8_8_ = in_stack_fffffffffffffee0;
  match.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffef0;
  match.super__Function_base._M_functor._M_unused._M_object = (void *)in_stack_fffffffffffffee8;
  match.super__Function_base._M_manager._0_1_ = in_stack_fffffffffffffef8;
  match.super__Function_base._M_manager._1_7_ = in_stack_fffffffffffffef9;
  match._M_invoker = in_stack_ffffffffffffff00;
  DebugLogHelper::DebugLogHelper(&local_70,message,match);
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,3);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  iVar2 = (*(((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_wallet_loader._M_t.
              super___uniq_ptr_impl<interfaces::WalletLoader,_std::default_delete<interfaces::WalletLoader>_>
              ._M_t.
              super__Tuple_impl<0UL,_interfaces::WalletLoader_*,_std::default_delete<interfaces::WalletLoader>_>
              .super__Head_base<0UL,_interfaces::WalletLoader_*,_false>._M_head_impl)->
            super_ChainClient)._vptr_ChainClient[3])();
  local_c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/init_tests.cpp"
  ;
  local_c0 = "";
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x2a;
  file.m_begin = (iterator)&local_c8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_d8,msg);
  local_f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((byte)iVar2 ^ 1);
  local_f0.m_message.px = (element_type *)0x0;
  local_f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_f0,(lazy_ostream *)&stack0xfffffffffffffef0,1,0,WARN,0xf88f97,
             (size_t)&stack0xfffffffffffffed0,0x2a);
  boost::detail::shared_count::~shared_count(&local_f0.m_message.pn);
  DebugLogHelper::~DebugLogHelper(&local_70);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(walletinit_verify_walletdir_does_not_exist)
{
    SetWalletDir(m_walletdir_path_cases["nonexistent"]);
    {
        ASSERT_DEBUG_LOG("does not exist");
        bool result = m_wallet_loader->verify();
        BOOST_CHECK(result == false);
    }
}